

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetUnlockingScriptTest_Test::TestBody
          (ConfidentialTransaction_SetUnlockingScriptTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertHelper local_6f8;
  Message local_6f0;
  Script local_6e8;
  string local_6b0;
  undefined1 local_690 [8];
  AssertionResult gtest_ar_2;
  Message local_678;
  ConfidentialTxInReference local_670;
  AssertHelper local_510;
  Message local_508;
  AssertHelper local_500;
  Message local_4f8 [2];
  CfdException *anon_var_0_1;
  char *pcStack_4e0;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> exp_list;
  string local_4b8;
  undefined1 local_498 [8];
  ByteData exp_data2;
  string local_478;
  undefined1 local_458 [8];
  ByteData exp_data1;
  Message local_438;
  string local_430;
  Script local_410;
  string local_3d8;
  undefined1 local_3b8 [8];
  AssertionResult gtest_ar_1;
  Message local_3a0;
  ConfidentialTxInReference local_398;
  undefined1 local_238 [8];
  ConfidentialTxInReference txin_ref;
  Message local_d0;
  AssertHelper local_c8;
  Message local_c0 [2];
  CfdException *anon_var_0;
  char *pcStack_a8;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  Message local_98;
  int local_8c;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Message local_70 [3];
  uint local_54;
  undefined1 local_50 [4];
  uint32_t index;
  ConfidentialTransaction tx;
  ConfidentialTransaction_SetUnlockingScriptTest_Test *this_local;
  
  tx.vout_.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,&exp_tx_hex_abi_cxx11_);
  local_54 = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_54 = cfd::core::ConfidentialTransaction::AddTxIn
                           ((ConfidentialTransaction *)local_50,&exp_txid,2,0xfffffffe,
                            (Script *)cfd::core::Script::Empty);
    }
  }
  else {
    testing::Message::Message(local_70);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24c,
               "Expected: (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_70);
  }
  local_8c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,int>
            ((EqHelper<false> *)local_88,"index","1",&local_54,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x24d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff58,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff58);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript
                ((ConfidentialTransaction *)local_50,local_54 + 5,&exp_script);
    }
    if ((anon_var_0._7_1_ & 1) == 0) {
      pcStack_a8 = 
      "Expected: (tx.SetUnlockingScript(index + 5, exp_script)) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0045800d;
    }
  }
  else {
LAB_0045800d:
    testing::Message::Message(local_c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x250,pcStack_a8);
    testing::internal::AssertHelper::operator=(&local_c8,local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(local_c0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript
                ((ConfidentialTransaction *)local_50,local_54,&exp_script);
    }
  }
  else {
    testing::Message::Message(&local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x251,
               "Expected: (tx.SetUnlockingScript(index, exp_script)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_d0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &txin_ref.pegin_witness_.witness_stack_.
                super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_d0);
  }
  cfd::core::ConfidentialTxInReference::ConfidentialTxInReference
            ((ConfidentialTxInReference *)local_238);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn(&local_398,(ConfidentialTransaction *)local_50,1);
      cfd::core::ConfidentialTxInReference::operator=
                ((ConfidentialTxInReference *)local_238,&local_398);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_398);
    }
  }
  else {
    testing::Message::Message(&local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x254,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_3a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_3a0);
  }
  cfd::core::AbstractTxInReference::GetUnlockingScript
            (&local_410,(AbstractTxInReference *)local_238);
  cfd::core::Script::GetHex_abi_cxx11_(&local_3d8,&local_410);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_430,&exp_script);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3b8,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_3d8);
  cfd::core::Script::~Script(&local_410);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b8);
  if (!bVar1) {
    testing::Message::Message(&local_438);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &exp_data1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x256,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &exp_data1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&local_438);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &exp_data1.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_478,"1234567890",
             (allocator *)
             ((long)&exp_data2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_458,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&exp_data2.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b8,"1234567890123456789012345678901234567890",
             (allocator *)
             ((long)&exp_list.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_498,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&exp_list.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1,
             (value_type *)local_458);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1,
             (value_type *)local_498);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffffb20,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffffb20);
  if (bVar1) {
    anon_var_0_1._7_1_ = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript
                ((ConfidentialTransaction *)local_50,local_54 + 5,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1);
    }
    if ((anon_var_0_1._7_1_ & 1) != 0) goto LAB_0045882d;
    pcStack_4e0 = 
    "Expected: (tx.SetUnlockingScript(index + 5, exp_list)) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_4f8);
  testing::internal::AssertHelper::AssertHelper
            (&local_500,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x25e,pcStack_4e0);
  testing::internal::AssertHelper::operator=(&local_500,local_4f8);
  testing::internal::AssertHelper::~AssertHelper(&local_500);
  testing::Message::~Message(local_4f8);
LAB_0045882d:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetUnlockingScript
                ((ConfidentialTransaction *)local_50,local_54,
                 (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1);
    }
  }
  else {
    testing::Message::Message(&local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x25f,
               "Expected: (tx.SetUnlockingScript(index, exp_list)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    testing::Message::~Message(&local_508);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::GetTxIn(&local_670,(ConfidentialTransaction *)local_50,1);
      cfd::core::ConfidentialTxInReference::operator=
                ((ConfidentialTxInReference *)local_238,&local_670);
      cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_670);
    }
  }
  else {
    testing::Message::Message(&local_678);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x261,
               "Expected: (txin_ref = tx.GetTxIn(1)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_678);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_678);
  }
  cfd::core::AbstractTxInReference::GetUnlockingScript
            (&local_6e8,(AbstractTxInReference *)local_238);
  cfd::core::Script::GetHex_abi_cxx11_(&local_6b0,&local_6e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_690,"txin_ref.GetUnlockingScript().GetHex().c_str()",
             "\"051234567890141234567890123456789012345678901234567890\"",pcVar2,
             "051234567890141234567890123456789012345678901234567890");
  std::__cxx11::string::~string((string *)&local_6b0);
  cfd::core::Script::~Script(&local_6e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_690);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_690);
    testing::internal::AssertHelper::AssertHelper
              (&local_6f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x263,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6f8,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper(&local_6f8);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_690);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&gtest_msg_1);
  cfd::core::ByteData::~ByteData((ByteData *)local_498);
  cfd::core::ByteData::~ByteData((ByteData *)local_458);
  cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference
            ((ConfidentialTxInReference *)local_238);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetUnlockingScriptTest) {
  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW((index = tx.AddTxIn(exp_txid, exp_index, exp_sequence)));
  EXPECT_EQ(index, 1);

  // SetUnlockingScript
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_script)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_script)));

  ConfidentialTxInReference txin_ref;
  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());

  // SetUnlockingScript2
  const ByteData exp_data1("1234567890");
  const ByteData exp_data2("1234567890123456789012345678901234567890");
  std::vector<ByteData> exp_list;
  exp_list.push_back(exp_data1);
  exp_list.push_back(exp_data2);
  EXPECT_THROW((tx.SetUnlockingScript(index + 5, exp_list)), CfdException);
  EXPECT_NO_THROW((tx.SetUnlockingScript(index, exp_list)));

  EXPECT_NO_THROW((txin_ref = tx.GetTxIn(1)));
  EXPECT_STREQ(txin_ref.GetUnlockingScript().GetHex().c_str(),
               "051234567890141234567890123456789012345678901234567890");
}